

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void __thiscall
IGNOREUnitTestMacros_CHECK_COMPAREWorksInAnIgnoredTest_Test::testBody
          (IGNOREUnitTestMacros_CHECK_COMPAREWorksInAnIgnoredTest_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_58 [2];
  SimpleString local_38;
  undefined1 local_28 [8];
  SimpleString conditionString;
  bool success;
  IGNOREUnitTestMacros_CHECK_COMPAREWorksInAnIgnoredTest_Test *this_local;
  
  conditionString.bufferSize_._7_1_ = 0;
  SimpleString::SimpleString((SimpleString *)local_28,"");
  StringFrom((int)&local_38);
  SimpleString::operator+=((SimpleString *)local_28,&local_38);
  SimpleString::~SimpleString(&local_38);
  SimpleString::operator+=((SimpleString *)local_28," ");
  SimpleString::operator+=((SimpleString *)local_28,">");
  SimpleString::operator+=((SimpleString *)local_28," ");
  StringFrom((int)local_58);
  SimpleString::operator+=((SimpleString *)local_28,local_58);
  SimpleString::~SimpleString(local_58);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_28);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x19])
            (pUVar1,0,"CHECK_COMPARE",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x196,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

IGNORE_TEST(UnitTestMacros, CHECK_COMPAREWorksInAnIgnoredTest)
{
  CHECK_COMPARE(1, >, 2); // LCOV_EXCL_LINE
}